

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QList<QtDependency> *
findFilesRecursively(QList<QtDependency> *__return_storage_ptr__,Options *options,QString *fileName)

{
  QString *pQVar1;
  Data *pDVar2;
  QtDependency *pQVar3;
  qsizetype qVar4;
  char cVar5;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> _Var6;
  QArrayData *pQVar7;
  QArrayData *pQVar8;
  long in_FS_OFFSET;
  QFileInfo info;
  QFileInfo info_1;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_const_QString_&> local_a0;
  undefined1 *local_80;
  QArrayDataPointer<QtDependency> local_78;
  QStringBuilder<const_QString_&,_char16_t> local_60;
  undefined1 local_50 [16];
  QString *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QtDependency *)0x0;
  local_78.size = 0;
  pQVar7 = (QArrayData *)
           (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar8 = (QArrayData *)
           (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pQVar7 != pQVar8) {
    do {
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_50._8_2_ = L'/';
      local_50._0_8_ = pQVar7;
      local_40 = fileName;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                ((QString *)&local_a0,
                 (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
                 local_50);
      QFileInfo::QFileInfo((QFileInfo *)&local_80,(QString *)&local_a0);
      if ((QArrayData *)local_a0.a.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate((QArrayData *)local_a0.a.a,2,0x10);
        }
      }
      cVar5 = QFileInfo::exists();
      if (cVar5 != '\0') {
        cVar5 = QFileInfo::isDir();
        if (cVar5 == '\0') {
          local_50._8_2_ = L'/';
          local_50._0_8_ = pQVar7;
          QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                    ((QString *)&local_a0,(QStringBuilder<const_QString_&,_char16_t> *)local_50);
          findFilesRecursively
                    (__return_storage_ptr__,options,(QFileInfo *)&local_80,(QString *)&local_a0);
          if ((QArrayData *)local_a0.a.a != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)local_a0.a.a,2,0x10);
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_80);
          goto LAB_0011b996;
        }
        local_60.b = L'/';
        local_60.a = (QString *)pQVar7;
        QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>((QString *)local_50,&local_60)
        ;
        findFilesRecursively
                  ((QList<QtDependency> *)&local_a0,options,(QFileInfo *)&local_80,
                   (QString *)local_50);
        if (local_a0.a.b.m_data != (char *)0x0) {
          if (((QArrayData *)local_a0.a.a == (QArrayData *)0x0) ||
             (1 < (((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i)
             ) {
            QtPrivate::QCommonArrayOps<QtDependency>::growAppend
                      ((QCommonArrayOps<QtDependency> *)&local_78,
                       (QtDependency *)local_a0.a.b.m_size,
                       (QtDependency *)(local_a0.a.b.m_size + local_a0.a.b.m_data * 0x30));
          }
          else {
            QArrayDataPointer<QtDependency>::detachAndGrow
                      (&local_78,GrowsAtEnd,(qsizetype)local_a0.a.b.m_data,(QtDependency **)0x0,
                       (QArrayDataPointer<QtDependency> *)0x0);
            QtPrivate::QGenericArrayOps<QtDependency>::moveAppend
                      ((QGenericArrayOps<QtDependency> *)&local_78,
                       (QtDependency *)local_a0.a.b.m_size,
                       (QtDependency *)(local_a0.a.b.m_size + local_a0.a.b.m_data * 0x30));
          }
        }
        QArrayDataPointer<QtDependency>::~QArrayDataPointer
                  ((QArrayDataPointer<QtDependency> *)&local_a0);
        if ((QArrayData *)local_50._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_50._0_8_,2,0x10);
          }
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_80);
      pQVar7 = (QArrayData *)&pQVar7[1].alloc;
    } while (pQVar7 != pQVar8);
    pQVar7 = (QArrayData *)
             (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pQVar8 = (QArrayData *)
             (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  pQVar1 = &options->qtInstallDirectory;
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<QString_const*,std::vector<QString,std::allocator<QString>>>,__gnu_cxx::__ops::_Iter_equals_val<QString_const>>
                    (pQVar7,pQVar8,pQVar1);
  if (_Var6._M_current ==
      (options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_60.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_a0.a.b.m_size = 1;
    local_a0.a.b.m_data = "/";
    local_a0.a.a = pQVar1;
    local_a0.b = fileName;
    QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_const_QString_&>::
    convertTo<QString>((QString *)local_50,&local_a0);
    QFileInfo::QFileInfo((QFileInfo *)&local_60,(QString *)local_50);
    if ((QArrayData *)local_50._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_50._0_8_,2,0x10);
      }
    }
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_50._8_8_ = (char16_t *)0x1;
    local_40 = (QString *)0x1471d4;
    local_50._0_8_ = pQVar1;
    QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_a0,(QStringBuilder<const_QString_&,_QLatin1String> *)local_50);
    QFileInfo::QFileInfo((QFileInfo *)&local_80,(QString *)&local_a0);
    if ((QArrayData *)local_a0.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_a0.a.a,2,0x10);
      }
    }
    QFileInfo::absolutePath();
    findFilesRecursively
              ((QList<QtDependency> *)&local_a0,options,(QFileInfo *)&local_60,(QString *)local_50);
    if (local_a0.a.b.m_data != (char *)0x0) {
      if (((QArrayData *)local_a0.a.a == (QArrayData *)0x0) ||
         (1 < (((QBasicAtomicInt *)&(local_a0.a.a)->d)->_q_value).super___atomic_base<int>._M_i)) {
        QtPrivate::QCommonArrayOps<QtDependency>::growAppend
                  ((QCommonArrayOps<QtDependency> *)&local_78,(QtDependency *)local_a0.a.b.m_size,
                   (QtDependency *)(local_a0.a.b.m_size + local_a0.a.b.m_data * 0x30));
      }
      else {
        QArrayDataPointer<QtDependency>::detachAndGrow
                  (&local_78,GrowsAtEnd,(qsizetype)local_a0.a.b.m_data,(QtDependency **)0x0,
                   (QArrayDataPointer<QtDependency> *)0x0);
        QtPrivate::QGenericArrayOps<QtDependency>::moveAppend
                  ((QGenericArrayOps<QtDependency> *)&local_78,(QtDependency *)local_a0.a.b.m_size,
                   (QtDependency *)(local_a0.a.b.m_size + local_a0.a.b.m_data * 0x30));
      }
    }
    QArrayDataPointer<QtDependency>::~QArrayDataPointer
              ((QArrayDataPointer<QtDependency> *)&local_a0);
    if ((QArrayData *)local_50._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_50._0_8_,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_80);
    QFileInfo::~QFileInfo((QFileInfo *)&local_60);
  }
  qVar4 = local_78.size;
  pQVar3 = local_78.ptr;
  pDVar2 = local_78.d;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QtDependency *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = pQVar3;
  local_78.size = 0;
  (__return_storage_ptr__->d).size = qVar4;
LAB_0011b996:
  QArrayDataPointer<QtDependency>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QtDependency> findFilesRecursively(const Options &options, const QString &fileName)
{
    // We try to find the fileName in extraPrefixDirs first. The function behaves differently
    // depending on what the fileName points to. If fileName is a file then we try to find the
    // first occurrence in extraPrefixDirs and return this file. If fileName is directory function
    // iterates over it and looks for deployment artifacts in each 'extraPrefixDirs' entry.
    // Also we assume that if the fileName is recognized as a directory once it will be directory
    // for every 'extraPrefixDirs' entry.
    QList<QtDependency> deps;
    for (const auto &prefix : options.extraPrefixDirs) {
        QFileInfo info(prefix + u'/' + fileName);
        if (info.exists()) {
            if (info.isDir())
                deps.append(findFilesRecursively(options, info, prefix + u'/'));
            else
                return findFilesRecursively(options, info, prefix + u'/');
        }
    }

    // Usually android deployment settings contain Qt install directory in extraPrefixDirs.
    if (std::find(options.extraPrefixDirs.begin(), options.extraPrefixDirs.end(),
                  options.qtInstallDirectory) == options.extraPrefixDirs.end()) {
        QFileInfo info(options.qtInstallDirectory + "/"_L1 + fileName);
        QFileInfo rootPath(options.qtInstallDirectory + "/"_L1);
        deps.append(findFilesRecursively(options, info, rootPath.absolutePath()));
    }
    return deps;
}